

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O2

void __thiscall Storage::Tape::TZX::get_next_pulses(TZX *this)

{
  FileHolder *this_00;
  bool bVar1;
  byte bVar2;
  Logger<(Log::Source)31> local_30 [8];
  
  this_00 = &this->file_;
  do {
    bVar1 = PulseQueuedTape::empty(&this->super_PulseQueuedTape);
    if (!bVar1) {
      return;
    }
    bVar2 = FileHolder::get8(this_00);
    bVar1 = FileHolder::eof(this_00);
    if (bVar1) {
      PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
      return;
    }
    switch(bVar2) {
    case 0x10:
      get_standard_speed_data_block(this);
      break;
    case 0x11:
      get_turbo_speed_data_block(this);
      break;
    case 0x12:
      get_pure_tone_data_block(this);
      break;
    case 0x13:
      get_pulse_sequence(this);
      break;
    case 0x14:
      get_pure_data_block(this);
      break;
    case 0x15:
      get_direct_recording_block(this);
      break;
    case 0x16:
    case 0x17:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x29:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x34:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
switchD_003ec552_caseD_16:
      Log::Logger<(Log::Source)31>::error(local_30);
      Log::Logger<(Log::Source)31>::LogLine::append
                ((LogLine *)local_30,"Unknown TZX chunk: %04x",(ulong)bVar2);
      Log::Logger<(Log::Source)31>::LogLine::~LogLine((LogLine *)local_30);
      PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
      return;
    case 0x18:
      get_csw_recording_block(this);
      break;
    case 0x19:
      get_generalised_data_block(this);
      break;
    case 0x20:
      get_pause(this);
      break;
    case 0x21:
      ignore_group_start(this);
      break;
    case 0x22:
    case 0x25:
    case 0x27:
      break;
    case 0x23:
    case 0x24:
      FileHolder::get16le(this_00);
      break;
    case 0x26:
      ignore_call_sequence(this);
      break;
    case 0x28:
      ignore_select_block(this);
      break;
    case 0x2a:
      ignore_stop_tape_if_in_48kb_mode(this);
      break;
    case 0x2b:
      get_set_signal_level(this);
      break;
    case 0x30:
      ignore_text_description(this);
      break;
    case 0x31:
      ignore_message_block(this);
      break;
    case 0x32:
      ignore_archive_info(this);
      break;
    case 0x33:
      get_hardware_type(this);
      break;
    case 0x35:
      ignore_custom_info_block(this);
      break;
    case 0x4b:
      get_kansas_city_block(this);
      break;
    default:
      if (bVar2 != 0x5a) goto switchD_003ec552_caseD_16;
      ignore_glue_block(this);
    }
  } while( true );
}

Assistant:

void TZX::get_next_pulses() {
	while(empty()) {
		uint8_t chunk_id = file_.get8();
		if(file_.eof()) {
			set_is_at_end(true);
			return;
		}

		switch(chunk_id) {
			case 0x10:	get_standard_speed_data_block();	break;
			case 0x11:	get_turbo_speed_data_block();		break;
			case 0x12:	get_pure_tone_data_block();			break;
			case 0x13:	get_pulse_sequence();				break;
			case 0x14:	get_pure_data_block();				break;
			case 0x15:	get_direct_recording_block();		break;
			case 0x18:	get_csw_recording_block();			break;
			case 0x19:	get_generalised_data_block();		break;
			case 0x20:	get_pause();						break;

			case 0x21:	ignore_group_start();				break;
			case 0x22:	ignore_group_end();					break;
			case 0x23:	ignore_jump_to_block();				break;
			case 0x24:	ignore_loop_start();				break;
			case 0x25:	ignore_loop_end();					break;
			case 0x26:	ignore_call_sequence();				break;
			case 0x27:	ignore_return_from_sequence();		break;
			case 0x28:	ignore_select_block();				break;
			case 0x2a:	ignore_stop_tape_if_in_48kb_mode();	break;

			case 0x2b:	get_set_signal_level();				break;

			case 0x30:	ignore_text_description();			break;
			case 0x31:	ignore_message_block();				break;
			case 0x32:	ignore_archive_info();				break;
			case 0x33:	get_hardware_type();				break;
			case 0x35:	ignore_custom_info_block();			break;

			case 0x4b:	get_kansas_city_block();			break;

			case 0x5a:	ignore_glue_block();				break;

			default:
				// In TZX each chunk has a different way of stating or implying its length,
				// so there is no route past an unimplemented chunk.
				logger.error().append("Unknown TZX chunk: %04x", chunk_id);
				set_is_at_end(true);
			return;
		}
	}
}